

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::SingleVertexArrayUsageTests::init
          (SingleVertexArrayUsageTests *this,EVP_PKEY_CTX *ctx)

{
  Usage usage_;
  GLValue max_;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  MultiVertexArrayTest *this_00;
  long lVar5;
  InputType type;
  long lVar6;
  GLValue GVar7;
  string name;
  Spec spec;
  ArraySpec arraySpec;
  long local_100;
  long local_f0;
  string local_d8;
  undefined1 local_b8 [16];
  pointer local_a8;
  pointer pAStack_a0;
  pointer local_98;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  ArraySpec local_70;
  
  local_100 = 0;
  do {
    local_f0 = 0;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      lVar5 = 0;
      do {
        lVar6 = 0;
        do {
          if (lVar5 == 1) {
            type = (&DAT_01bc2720)[local_100];
            iVar3 = deqp::gls::Array::inputTypeSize(type);
            iVar3 = iVar3 * 2;
          }
          else {
            iVar3 = (&DAT_01bc2750)[lVar5];
            type = (&DAT_01bc2720)[local_100];
          }
          iVar4 = deqp::gls::Array::inputTypeSize(type);
          usage_ = *(Usage *)((long)&DAT_01ba852c + lVar6);
          GVar7 = deqp::gls::GLValue::getMinValue(type);
          aStack_78 = GVar7.field_1;
          local_80 = GVar7.type;
          GVar7 = deqp::gls::GLValue::getMaxValue(type);
          aStack_88 = GVar7.field_1;
          local_90 = GVar7.type;
          max_._4_4_ = uStack_8c;
          max_.type = local_90;
          GVar7._4_4_ = uStack_7c;
          GVar7.type = local_80;
          GVar7.field_1 = aStack_78;
          max_.field_1 = aStack_88;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    (&local_70,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,usage_,2,0,iVar3,false,GVar7,max_
                    );
          local_a8 = (pointer)0x0;
          pAStack_a0 = (pointer)0x0;
          local_98 = (pointer)0x0;
          local_b8._0_4_ = PRIMITIVE_TRIANGLES;
          local_b8._4_4_ = (&DAT_01bc2920)[local_f0];
          local_b8._8_4_ = 0;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
          ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                    ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                      *)&local_a8,(iterator)0x0,&local_70);
          deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&local_d8,(Spec *)local_b8);
          if (iVar3 % iVar4 == 0) {
            this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                               m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                       (Spec *)local_b8,local_d8._M_dataplus._M_p,local_d8._M_dataplus._M_p);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if (local_a8 != (pointer)0x0) {
            operator_delete(local_a8,(long)local_98 - (long)local_a8);
          }
          lVar6 = lVar6 + 4;
        } while (lVar6 != 0xc);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      local_f0 = 1;
      bVar1 = false;
    } while (bVar2);
    local_100 = local_100 + 1;
  } while (local_100 != 4);
  return 0;
}

Assistant:

void SingleVertexArrayUsageTests::init (void)
{
	// Test usage
	Array::Usage		usages[]		= {Array::USAGE_STATIC_DRAW, Array::USAGE_STREAM_DRAW, Array::USAGE_DYNAMIC_DRAW};
	int					counts[]		= {1, 256};
	int					strides[]		= {0, -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_FIXED, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usages); usageNdx++)
				{
					const int	componentCount	= 2;
					const int	stride			= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * componentCount : strides[strideNdx]);
					const bool	aligned			= (stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0;
					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	usages[usageNdx],
																	componentCount,
																	0,
																	stride,
																	false,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();

					if (aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}